

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDPSolver.cpp
# Opt level: O2

void __thiscall MDPSolver::LoadQTables(MDPSolver *this,string *filename,int nrTables,QTables *Qs)

{
  size_t nrRows;
  size_t nrColumns;
  
  nrRows = PlanningUnitMADPDiscrete::GetNrStates(&this->_m_pu->super_PlanningUnitMADPDiscrete);
  nrColumns = (**(code **)((long)*(this->_m_pu->super_PlanningUnitMADPDiscrete)._m_madp + 0x68))();
  QTable::Load(filename,nrRows,nrColumns,(long)nrTables,Qs);
  return;
}

Assistant:

void MDPSolver::LoadQTables(const string &filename, int nrTables,
                            QTables &Qs)
{
    QTable::Load(filename,
                 GetPU()->GetNrStates(),
                 GetPU()->GetNrJointActions(),
                 nrTables,
                 Qs);
}